

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

attr_list decode_attr_from_xmit(void *buf)

{
  byte bVar1;
  short sVar2;
  attr_p paVar3;
  int iVar4;
  attr_list p_Var5;
  double *pdVar6;
  byte *__src;
  void *pvVar7;
  byte *in_RDI;
  bool bVar8;
  attr_opaque op;
  char *value;
  int pad_len;
  int2 len;
  int i;
  char *optr;
  int bswap;
  attr_list l;
  int iattr_size;
  int_attr_p header;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  uchar local_64;
  uint local_60;
  undefined4 uStack_54;
  int local_34;
  double *local_30;
  
  iVar4 = (in_RDI[1] - 1) * 8 + 0xc;
  p_Var5 = internal_create_attr_list
                     ((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90
                     );
  bVar1 = *in_RDI;
  if (words_bigendian == -1) {
    local_60 = set_bigendian();
  }
  else {
    local_60 = words_bigendian;
  }
  bVar8 = bVar1 != local_60;
  local_30 = (double *)(in_RDI + iVar4);
  memcpy((p_Var5->l).lists.lists,in_RDI,(long)iVar4);
  if (words_bigendian == -1) {
    iVar4 = set_bigendian();
    local_64 = (uchar)iVar4;
  }
  else {
    local_64 = (uchar)words_bigendian;
  }
  ((p_Var5->l).list.iattrs)->byte_order = local_64;
  if (bVar8) {
    for (local_34 = 0; local_34 < (int)(uint)in_RDI[1]; local_34 = local_34 + 1) {
      byte_swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      byte_swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
  }
  for (local_34 = 0; local_34 < (int)(uint)in_RDI[2]; local_34 = local_34 + 1) {
    *(double *)((p_Var5->l).list.attributes + local_34) = *local_30;
    if (bVar8) {
      byte_swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      byte_swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    pdVar6 = local_30 + 1;
    in_stack_ffffffffffffff90 = (char *)(ulong)(p_Var5->l).list.attributes[local_34].val_type;
    switch(in_stack_ffffffffffffff90) {
    case (char *)0x0:
    case (char *)0x1:
    case (char *)0x7:
    case (char *)0x9:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                    ,0x72f,"attr_list decode_attr_from_xmit(void *)");
    case (char *)0x2:
      (p_Var5->l).list.attributes[local_34].value.u.d = *pdVar6;
      if (bVar8) {
        byte_swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
      pdVar6 = local_30 + 2;
      break;
    case (char *)0x3:
    case (char *)0x4:
      sVar2 = *(short *)pdVar6;
      if (bVar8) {
        byte_swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
      __src = (byte *)((long)local_30 + 10);
      if ((p_Var5->l).list.attributes[local_34].val_type == Attr_String) {
        pvVar7 = malloc((long)sVar2);
        memcpy(pvVar7,__src,(long)sVar2);
        (p_Var5->l).list.attributes[local_34].value.u.p = pvVar7;
      }
      else {
        pvVar7 = malloc((long)sVar2);
        memcpy(pvVar7,__src,(long)sVar2);
        paVar3 = (p_Var5->l).list.attributes;
        paVar3[local_34].value.u.l = CONCAT44(uStack_54,(int)sVar2);
        paVar3[local_34].value.u.o.buffer = pvVar7;
      }
      pdVar6 = (double *)(__src + (int)(((int)sVar2 + 5U & 0xfffffffc) - 2));
      break;
    case (char *)0x5:
      (p_Var5->l).list.attributes[local_34].value.u.f = *(float *)pdVar6;
      if (bVar8) {
        byte_swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
      pdVar6 = (double *)((long)local_30 + 0xc);
      break;
    case (char *)0x6:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                    ,0x756,"attr_list decode_attr_from_xmit(void *)");
    case (char *)0x8:
      (p_Var5->l).list.attributes[local_34].value.u.d = *pdVar6;
      if (bVar8) {
        byte_swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
      pdVar6 = local_30 + 2;
    }
    local_30 = pdVar6;
  }
  return p_Var5;
}

Assistant:

extern attr_list
decode_attr_from_xmit(void * buf)
{
    int_attr_p header = (int_attr_p) buf;
    int iattr_size = sizeof(struct int_attr_struct) + 
	(header->int_attr_count -1) * sizeof(int_attr);
    attr_list l = internal_create_attr_list(header->int_attr_count,
					    header->other_attr_count);
    /* byte swap if the encoders byte order is not equal to ours */
    int bswap = header->byte_order != WORDS_BIGENDIAN;
    char *optr = (char*)buf + iattr_size;
    int i;
    
    memcpy(l->l.list.iattrs, buf, iattr_size);
    l->l.list.iattrs->byte_order = WORDS_BIGENDIAN; /* overwrite original */
    if (bswap) {
	for (i=0; i < header->int_attr_count; i++) {
	    byte_swap((char*)&l->l.list.iattrs->iattr[i].attr_id, 4);
	    byte_swap((char*)&l->l.list.iattrs->iattr[i].value, 4);
	}
    }
    for (i=0; i< header->other_attr_count; i++) {
	memcpy(&l->l.list.attributes[i], optr, 8);
	if (bswap) {
	    byte_swap((char*)&l->l.list.attributes[i].attr_id, 4);
	    byte_swap((char*)&l->l.list.attributes[i].val_type, 4);
	}
	optr += 8;
	switch(l->l.list.attributes[i].val_type) {
	case Attr_Int4:
	case Attr_Undefined:
	case Attr_Float16:
	case Attr_Float4:
	    assert(0);
	    break;
	case Attr_Int8:
	    memcpy(&l->l.list.attributes[i].value, optr, 8);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 8);
	    optr += 8;
	    break;
	case Attr_Float8:
	    memcpy(&l->l.list.attributes[i].value, optr, 8);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 8);
	    optr += 8;
	    break;
	case Attr_Atom:
	    memcpy(&l->l.list.attributes[i].value, optr, 4);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 4);
	    optr += 4;
	    break;
	case Attr_Opaque:
	case Attr_String: {
	    int2 len = *(int2*)optr;
	    int pad_len;
	    if (bswap) byte_swap((char*)&len, 2);
	    pad_len = roundup4(len + 2) - 2;
	    optr += 2;
	    if (l->l.list.attributes[i].val_type == Attr_String) {
		char *value = malloc(len);
		memcpy(value, optr, len);
		l->l.list.attributes[i].value.u.p = value;
	    } else {
		attr_opaque op;
		op.length = len;
		op.buffer = malloc(len);
		memcpy(op.buffer, optr, len);
		l->l.list.attributes[i].value.u.o = op;
	    }
	    optr += pad_len;
	    break;
	  }
	case Attr_List:
	    assert(0);
	    break;
	}
    }
    return l;
}